

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::PolygonOffsetTestCase::iterate(PolygonOffsetTestCase *this)

{
  int iVar1;
  GLenum GVar2;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  RenderTarget *pRVar4;
  NotSupportedError *pNVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  allocator<char> local_209;
  string local_208;
  byte local_1e5;
  GLuint local_1e4;
  GLuint GStack_1e0;
  bool fboComplete;
  GLuint fboId;
  GLuint depthRboId;
  GLuint colorRboId;
  Functions *gl;
  string local_1c8;
  int local_1a4;
  int local_1a0;
  int height;
  int width;
  MessageBuilder local_190;
  PolygonOffsetTestCase *local_10;
  PolygonOffsetTestCase *this_local;
  
  local_10 = this;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_190,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_190,(char (*) [28])"Testing PolygonOffset with ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_internalFormatName);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])" depth buffer.");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_190);
  if (this->m_internalFormat == 0) {
    pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
    local_1a0 = tcu::RenderTarget::getWidth(pRVar4);
    pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
    local_1a4 = tcu::RenderTarget::getHeight(pRVar4);
    checkCanvasSize(local_1a0,local_1a4,this->m_targetSize,this->m_targetSize);
    pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar1 = tcu::RenderTarget::getDepthBits(pRVar4);
    if (iVar1 == 0) {
      gl._6_1_ = 1;
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"polygon offset tests require depth buffer",
                 (allocator<char> *)((long)&gl + 7));
      tcu::NotSupportedError::NotSupportedError(pNVar5,&local_1c8);
      gl._6_1_ = 0;
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  }
  else {
    pRVar6 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar6->_vptr_RenderContext[3])();
    _depthRboId = (Functions *)CONCAT44(extraout_var,iVar1);
    fboId = 0;
    GStack_1e0 = 0;
    local_1e4 = 0;
    (*_depthRboId->genRenderbuffers)(1,&fboId);
    (*_depthRboId->bindRenderbuffer)(0x8d41,fboId);
    (*_depthRboId->renderbufferStorage)(0x8d41,0x8056,this->m_targetSize,this->m_targetSize);
    verifyError((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,_depthRboId,0);
    (*_depthRboId->genRenderbuffers)(1,&stack0xfffffffffffffe20);
    (*_depthRboId->bindRenderbuffer)(0x8d41,GStack_1e0);
    (*_depthRboId->renderbufferStorage)
              (0x8d41,this->m_internalFormat,this->m_targetSize,this->m_targetSize);
    verifyError((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,_depthRboId,0);
    (*_depthRboId->genFramebuffers)(1,&local_1e4);
    (*_depthRboId->bindFramebuffer)(0x8d40,local_1e4);
    (*_depthRboId->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,fboId);
    (*_depthRboId->framebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,GStack_1e0);
    verifyError((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,_depthRboId,0);
    GVar2 = (*_depthRboId->checkFramebufferStatus)(0x8d40);
    local_1e5 = GVar2 == 0x8cd5;
    if ((bool)local_1e5) {
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    }
    (*_depthRboId->deleteFramebuffers)(1,&local_1e4);
    (*_depthRboId->deleteRenderbuffers)(1,&stack0xfffffffffffffe20);
    (*_depthRboId->deleteRenderbuffers)(1,&fboId);
    if ((local_1e5 & 1) == 0) {
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"could not create fbo for testing.",&local_209);
      tcu::NotSupportedError::NotSupportedError(pNVar5,&local_208);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  return STOP;
}

Assistant:

PolygonOffsetTestCase::IterateResult PolygonOffsetTestCase::iterate (void)
{
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	m_testCtx.getLog() << tcu::TestLog::Message << "Testing PolygonOffset with " << m_internalFormatName << " depth buffer." << tcu::TestLog::EndMessage;

	if (m_internalFormat == 0)
	{
		// default framebuffer
		const int width		= m_context.getRenderTarget().getWidth();
		const int height	= m_context.getRenderTarget().getHeight();

		checkCanvasSize(width, height, m_targetSize, m_targetSize);

		if (m_context.getRenderTarget().getDepthBits() == 0)
			throw tcu::NotSupportedError("polygon offset tests require depth buffer");

		testPolygonOffset();
	}
	else
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		// framebuffer object
		GLuint	colorRboId	= 0;
		GLuint	depthRboId	= 0;
		GLuint	fboId		= 0;
		bool	fboComplete;

		gl.genRenderbuffers(1, &colorRboId);
		gl.bindRenderbuffer(GL_RENDERBUFFER, colorRboId);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA4, m_targetSize, m_targetSize);
		verifyError(m_testCtx, gl, GL_NO_ERROR);

		gl.genRenderbuffers(1, &depthRboId);
		gl.bindRenderbuffer(GL_RENDERBUFFER, depthRboId);
		gl.renderbufferStorage(GL_RENDERBUFFER, m_internalFormat, m_targetSize, m_targetSize);
		verifyError(m_testCtx, gl, GL_NO_ERROR);

		gl.genFramebuffers(1, &fboId);
		gl.bindFramebuffer(GL_FRAMEBUFFER, fboId);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRboId);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT,	GL_RENDERBUFFER, depthRboId);
		verifyError(m_testCtx, gl, GL_NO_ERROR);

		fboComplete = gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE;

		if (fboComplete)
			testPolygonOffset();

		gl.deleteFramebuffers(1, &fboId);
		gl.deleteRenderbuffers(1, &depthRboId);
		gl.deleteRenderbuffers(1, &colorRboId);

		if (!fboComplete)
			throw tcu::NotSupportedError("could not create fbo for testing.");
	}

	return STOP;
}